

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O2

void __thiscall leveldb::MemTable::MemTable(MemTable *this,InternalKeyComparator *comparator)

{
  KeyComparator local_30;
  
  (this->comparator_).comparator.super_Comparator._vptr_Comparator =
       (_func_int **)&PTR__Comparator_0016b768;
  (this->comparator_).comparator.user_comparator_ = comparator->user_comparator_;
  this->refs_ = 0;
  Arena::Arena(&this->arena_);
  local_30.comparator.super_Comparator._vptr_Comparator = (_func_int **)&PTR__Comparator_0016b768;
  local_30.comparator.user_comparator_ = (this->comparator_).comparator.user_comparator_;
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::SkipList
            (&this->table_,&local_30,&this->arena_);
  Comparator::~Comparator((Comparator *)&local_30);
  return;
}

Assistant:

MemTable::MemTable(const InternalKeyComparator& comparator)
    : comparator_(comparator), refs_(0), table_(comparator_, &arena_) {}